

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

Opa_Man_t * Opa_ManStart(Gia_Man_t *pGia)

{
  int iVar1;
  Opa_Man_t *pOVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  bool bVar5;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Opa_Man_t *p;
  Gia_Man_t *pGia_local;
  
  pOVar2 = (Opa_Man_t *)calloc(1,0x28);
  pOVar2->pGia = pGia;
  iVar1 = Gia_ManPoNum(pGia);
  pVVar3 = (Vec_Int_t *)calloc((long)iVar1,0x10);
  pOVar2->pvParts = pVVar3;
  iVar1 = Gia_ManObjNum(pGia);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  iVar1 = Gia_ManObjNum(pGia);
  memset(piVar4,0xff,(long)iVar1 << 2);
  pOVar2->pId2Part = piVar4;
  pVVar3 = Vec_IntAlloc(100);
  pOVar2->vFront = pVVar3;
  local_24 = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(pGia);
    bVar5 = false;
    if (local_24 < iVar1) {
      pGStack_20 = Gia_ManCo(pGia,local_24);
      bVar5 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    pVVar3 = pOVar2->pvParts;
    iVar1 = Gia_ObjId(pGia,pGStack_20);
    Vec_IntPush(pVVar3 + local_24,iVar1);
    piVar4 = pOVar2->pId2Part;
    iVar1 = Gia_ObjId(pGia,pGStack_20);
    piVar4[iVar1] = local_24;
    pVVar3 = pOVar2->vFront;
    iVar1 = Gia_ObjId(pGia,pGStack_20);
    Vec_IntPush(pVVar3,iVar1);
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_ManPoNum(pGia);
  pOVar2->nParts = iVar1;
  return pOVar2;
}

Assistant:

static inline Opa_Man_t * Opa_ManStart( Gia_Man_t * pGia)
{
    Opa_Man_t * p;
    Gia_Obj_t * pObj;
    int i;
    p = ABC_CALLOC( Opa_Man_t, 1 );
    p->pGia = pGia;
    p->pvParts  = ABC_CALLOC( Vec_Int_t, Gia_ManPoNum(pGia) );
    p->pId2Part = ABC_FALLOC( int, Gia_ManObjNum(pGia) );
    p->vFront   = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( pGia, pObj, i )
    {
        Vec_IntPush( p->pvParts + i, Gia_ObjId(pGia, pObj) );
        p->pId2Part[Gia_ObjId(pGia, pObj)] = i;
        Vec_IntPush( p->vFront, Gia_ObjId(pGia, pObj) );
    }
    p->nParts = Gia_ManPoNum(pGia);
    return p;
}